

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O0

int DisconnectgpControl(GPCONTROL *pgpControl)

{
  int iVar1;
  GPCONTROL *pgpControl_local;
  
  if ((pgpControl->bDisableHTTPPersistent == 0) &&
     (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 != 0)) {
    printf("Error while disconnecting a gpControl.\n");
    CloseRS232Port(&pgpControl->RS232Port);
    pgpControl_local._4_4_ = 1;
  }
  else {
    iVar1 = CloseRS232Port(&pgpControl->RS232Port);
    if (iVar1 == 0) {
      printf("gpControl disconnected.\n");
      pgpControl_local._4_4_ = 0;
    }
    else {
      printf("gpControl disconnection failed.\n");
      pgpControl_local._4_4_ = 1;
    }
  }
  return pgpControl_local._4_4_;
}

Assistant:

inline int DisconnectgpControl(GPCONTROL* pgpControl)
{
	if (!pgpControl->bDisableHTTPPersistent)
	{
		if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
		{
			printf("Error while disconnecting a gpControl.\n");
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}

	if (CloseRS232Port(&pgpControl->RS232Port) != EXIT_SUCCESS)
	{
		printf("gpControl disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("gpControl disconnected.\n");

	return EXIT_SUCCESS;
}